

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.c
# Opt level: O0

void * cexpand(int_t *prev_len,MemType type,int_t len_to_copy,int keep_prev,GlobalLU_t *Glu)

{
  ExpHeader *pEVar1;
  int iVar2;
  void *pvVar3;
  int_t *piVar4;
  ExpHeader *expanders;
  int local_58;
  int extra;
  int lword;
  int tries;
  int_t bytes_to_copy;
  int_t new_len;
  void *old_mem;
  void *new_mem;
  float alpha;
  float EXPAND;
  GlobalLU_t *Glu_local;
  int keep_prev_local;
  int_t len_to_copy_local;
  MemType type_local;
  int_t *prev_len_local;
  
  pEVar1 = Glu->expanders;
  new_mem._0_4_ = 1.5;
  if ((Glu->num_expansions == 0) || (keep_prev != 0)) {
    tries = *prev_len;
  }
  else {
    tries = (int)((float)*prev_len * 1.5);
  }
  if ((type == LSUB) || (type == USUB)) {
    local_58 = 4;
  }
  else {
    local_58 = 8;
  }
  if (Glu->MemModel == SYSTEM) {
    old_mem = superlu_malloc((long)tries * (long)local_58);
    if (Glu->num_expansions != 0) {
      extra = 0;
      if (keep_prev == 0) {
        while (old_mem == (void *)0x0) {
          extra = extra + 1;
          if (10 < extra) {
            return (void *)0x0;
          }
          new_mem._0_4_ = (new_mem._0_4_ + 1.0) / 2.0;
          tries = (int)(new_mem._0_4_ * (float)*prev_len);
          old_mem = superlu_malloc((long)tries * (long)local_58);
        }
      }
      else if (old_mem == (void *)0x0) {
        return (void *)0x0;
      }
      if ((type == LSUB) || (type == USUB)) {
        copy_mem_int(len_to_copy,pEVar1[type].mem,old_mem);
      }
      else {
        copy_mem_singlecomplex(len_to_copy,pEVar1[type].mem,old_mem);
      }
      superlu_free(pEVar1[type].mem);
    }
    pEVar1[type].mem = old_mem;
  }
  else if (Glu->num_expansions == 0) {
    pvVar3 = cuser_malloc(tries * local_58,0,Glu);
    old_mem = pvVar3;
    if ((((ulong)pvVar3 & 7) != 0) && ((type == LUSUP || (type == UCOL)))) {
      old_mem = (void *)((long)pvVar3 + 7U & 0xfffffffffffffff8);
      iVar2 = (int)old_mem - (int)pvVar3;
      (Glu->stack).top1 = iVar2 + (Glu->stack).top1;
      (Glu->stack).used = iVar2 + (Glu->stack).used;
    }
    pEVar1[type].mem = old_mem;
  }
  else {
    extra = 0;
    expanders._4_4_ = (tries - *prev_len) * local_58;
    if (keep_prev == 0) {
      while ((Glu->stack).size <= expanders._4_4_ + (Glu->stack).used) {
        extra = extra + 1;
        if (10 < extra) {
          return (void *)0x0;
        }
        new_mem._0_4_ = (new_mem._0_4_ + 1.0) / 2.0;
        tries = (int)(new_mem._0_4_ * (float)*prev_len);
        expanders._4_4_ = (tries - *prev_len) * local_58;
      }
    }
    else if ((Glu->stack).size <= expanders._4_4_ + (Glu->stack).used) {
      return (void *)0x0;
    }
    if (type != USUB) {
      user_bcopy((char *)pEVar1[type + UCOL].mem,
                 (char *)((long)pEVar1[type + UCOL].mem + (long)expanders._4_4_),
                 ((int)(Glu->stack).array + (Glu->stack).top1) - (int)pEVar1[type + UCOL].mem);
      if (type < USUB) {
        piVar4 = (int_t *)((long)pEVar1[3].mem + (long)expanders._4_4_);
        pEVar1[3].mem = piVar4;
        Glu->usub = piVar4;
      }
      if (type < LSUB) {
        piVar4 = (int_t *)((long)pEVar1[2].mem + (long)expanders._4_4_);
        pEVar1[2].mem = piVar4;
        Glu->lsub = piVar4;
      }
      if (type == LUSUP) {
        pvVar3 = (void *)((long)pEVar1[1].mem + (long)expanders._4_4_);
        pEVar1[1].mem = pvVar3;
        Glu->ucol = pvVar3;
      }
      (Glu->stack).top1 = expanders._4_4_ + (Glu->stack).top1;
      (Glu->stack).used = expanders._4_4_ + (Glu->stack).used;
      if (type == UCOL) {
        (Glu->stack).top1 = expanders._4_4_ + (Glu->stack).top1;
        (Glu->stack).used = expanders._4_4_ + (Glu->stack).used;
      }
    }
  }
  pEVar1[type].size = tries;
  *prev_len = tries;
  if (Glu->num_expansions != 0) {
    Glu->num_expansions = Glu->num_expansions + 1;
  }
  return pEVar1[type].mem;
}

Assistant:

void
*cexpand (
	 int_t *prev_len,   /* length used from previous call */
	 MemType type,    /* which part of the memory to expand */
	 int_t len_to_copy, /* size of the memory to be copied to new store */
	 int keep_prev,   /* = 1: use prev_len;
			     = 0: compute new_len to expand */
	 GlobalLU_t *Glu  /* modified - global LU data structures */
	)
{
    float    EXPAND = 1.5;
    float    alpha;
    void     *new_mem, *old_mem;
    int_t    new_len, bytes_to_copy;
    int      tries, lword, extra;
    ExpHeader *expanders = Glu->expanders; /* Array of 4 types of memory */

    alpha = EXPAND;

    if ( Glu->num_expansions == 0 || keep_prev ) {
        /* First time allocate requested */
        new_len = *prev_len;
    } else {
	new_len = alpha * *prev_len;
    }
    
    if ( type == LSUB || type == USUB ) lword = sizeof(int_t);
    else lword = sizeof(singlecomplex);

    if ( Glu->MemModel == SYSTEM ) {
	new_mem = (void *) SUPERLU_MALLOC((size_t)new_len * lword);
	if ( Glu->num_expansions != 0 ) {
	    tries = 0;
	    if ( keep_prev ) {
		if ( !new_mem ) return (NULL);
	    } else {
		while ( !new_mem ) {
		    if ( ++tries > 10 ) return (NULL);
		    alpha = Reduce(alpha);
		    new_len = alpha * *prev_len;
		    new_mem = (void *) SUPERLU_MALLOC((size_t)new_len * lword);
		}
	    }
	    if ( type == LSUB || type == USUB ) {
		copy_mem_int(len_to_copy, expanders[type].mem, new_mem);
	    } else {
		copy_mem_singlecomplex(len_to_copy, expanders[type].mem, new_mem);
	    }
	    SUPERLU_FREE (expanders[type].mem);
	}
	expanders[type].mem = (void *) new_mem;
	
    } else { /* MemModel == USER */
    
	if ( Glu->num_expansions == 0 ) { /* First time initialization */
	
	    new_mem = cuser_malloc(new_len * lword, HEAD, Glu);
	    if ( NotDoubleAlign(new_mem) &&
		(type == LUSUP || type == UCOL) ) {
		old_mem = new_mem;
		new_mem = (void *)DoubleAlign(new_mem);
		extra = (char*)new_mem - (char*)old_mem;
#if ( DEBUGlevel>=1 )
		printf("expand(): not aligned, extra %d\n", extra);
#endif		
		Glu->stack.top1 += extra;
		Glu->stack.used += extra;
	    }
	    
	    expanders[type].mem = (void *) new_mem;
	    
	} else { /* CASE: num_expansions != 0 */
	
	    tries = 0;
	    extra = (new_len - *prev_len) * lword;
	    if ( keep_prev ) {
		if ( StackFull(extra) ) return (NULL);
	    } else {
		while ( StackFull(extra) ) {
		    if ( ++tries > 10 ) return (NULL);
		    alpha = Reduce(alpha);
		    new_len = alpha * *prev_len;
		    extra = (new_len - *prev_len) * lword;	    
		}
	    }

	      /* Need to expand the memory: moving the content after the current MemType
	      	 to make extra room for the current MemType.
              	 Memory layout: [ LUSUP || UCOL || LSUB || USUB ]
	      */
  	    if ( type != USUB ) {
		new_mem = (void*)((char*)expanders[type + 1].mem + extra);
		bytes_to_copy = (char*)Glu->stack.array + Glu->stack.top1
		    - (char*)expanders[type + 1].mem;
		user_bcopy(expanders[type+1].mem, new_mem, bytes_to_copy);

		if ( type < USUB ) {
		    Glu->usub = expanders[USUB].mem =
			(void*)((char*)expanders[USUB].mem + extra);
		}
		if ( type < LSUB ) {
		    Glu->lsub = expanders[LSUB].mem =
			(void*)((char*)expanders[LSUB].mem + extra);
		}
		if ( type < UCOL ) {
		    Glu->ucol = expanders[UCOL].mem =
			(void*)((char*)expanders[UCOL].mem + extra);
		}
		Glu->stack.top1 += extra;
		Glu->stack.used += extra;
		if ( type == UCOL ) {
		    Glu->stack.top1 += extra;   /* Add same amount for USUB */
		    Glu->stack.used += extra;
		}
		
	    } /* end expansion */

	} /* else ... */
    }

    expanders[type].size = new_len;
    *prev_len = new_len;
    if ( Glu->num_expansions ) ++Glu->num_expansions;
    
    return (void *) expanders[type].mem;
    
}